

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<short,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  size_type *psVar2;
  short sVar3;
  FunctionData *pFVar4;
  Vector *pVVar5;
  uint64_t uVar6;
  reference pvVar7;
  ulong uVar8;
  unsigned_long *q;
  size_type *psVar9;
  idx_t iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QuantileDirect<short> local_a9;
  list_entry_t *local_a8;
  AggregateFinalizeData *local_a0;
  long local_98;
  pointer local_90;
  FunctionData *local_88;
  Vector *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar5 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar6 = duckdb::ListVector::GetListSize(finalize_data->result);
    local_88 = pFVar4 + 8;
    local_a0 = finalize_data;
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar4 + 0x10) - *(long *)(pFVar4 + 8)) / 0x68 + uVar6);
    local_90 = (state->v).super_vector<short,_std::allocator<short>_>.
               super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_98 = uVar6 * 2 + *(long *)(pVVar5 + 0x20);
    target->offset = uVar6;
    psVar2 = *(size_type **)(pFVar4 + 0x28);
    uVar8 = 0;
    local_a8 = target;
    local_80 = pVVar5;
    for (psVar9 = *(size_type **)(pFVar4 + 0x20); psVar9 != psVar2; psVar9 = psVar9 + 1) {
      pvVar7 = vector<duckdb::QuantileValue,_true>::get<true>
                         ((vector<duckdb::QuantileValue,_true> *)local_88,*psVar9);
      iVar10 = (long)(state->v).super_vector<short,_std::allocator<short>_>.
                     super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(state->v).super_vector<short,_std::allocator<short>_>.
                     super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start >> 1;
      local_78.desc = *(bool *)(pFVar4 + 0x38);
      lVar1 = iVar10 - 1;
      auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = 0x45300000;
      dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
      local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                    pvVar7->dbl;
      local_48 = local_78.RN;
      dVar11 = floor(local_78.RN);
      local_78.FRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
      dVar11 = ceil(local_48);
      local_78.CRN = (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11;
      local_78.begin = uVar8;
      local_78.end = iVar10;
      sVar3 = Interpolator<false>::Operation<short,short,duckdb::QuantileDirect<short>>
                        (&local_78,local_90,local_80,&local_a9);
      *(short *)(local_98 + *psVar9 * 2) = sVar3;
      uVar8 = local_78.FRN;
    }
    uVar6 = (*(long *)(pFVar4 + 0x10) - *(long *)(pFVar4 + 8)) / 0x68;
    local_a8->length = uVar6;
    duckdb::ListVector::SetListSize(local_a0->result,uVar6 + local_a8->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}